

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_update5_ghosts(Integer g_a)

{
  int *ptr1;
  logical lVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  long in_RDI;
  Integer p_handle;
  int local_sync_end;
  int local_sync_begin;
  char *cache;
  char *ptr_rem;
  char *ptr_loc;
  int proc_rem;
  int corner_flag;
  int msgcnt;
  int *count;
  int *stride_rem;
  int *stride_loc;
  Integer *proc_rem_ptr;
  Integer width [7];
  Integer nwidth;
  Integer ndim;
  Integer handle;
  Integer i;
  Integer idx;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int iVar5;
  int iVar6;
  double *dst_ptr;
  int *dst_ptr_00;
  int local_a4;
  int iVar7;
  int iVar8;
  int iVar9;
  C_Integer aCStack_78 [8];
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  logical local_8;
  
  iVar5 = _ga_sync_end;
  iVar6 = _ga_sync_begin;
  local_28 = in_RDI + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  ptr1 = (int *)(long)GA[local_28].p_handle;
  local_a4 = in_stack_ffffffffffffff28;
  local_10 = in_RDI;
  if (iVar6 != 0) {
    pnga_pgroup_sync(CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_a4 = in_stack_ffffffffffffff28;
  }
  dst_ptr = GA[local_28].cache;
  lVar1 = pnga_has_ghosts(local_10);
  if (lVar1 == 0) {
    local_8 = 1;
  }
  else {
    local_30 = (long)GA[local_28].ndim;
    for (local_20 = 0; local_20 < local_30; local_20 = local_20 + 1) {
      aCStack_78[local_20] = GA[local_28].width[local_20];
    }
    lVar1 = gai_check_ghost_distr(local_10);
    if (lVar1 == 0) {
      local_8 = 0;
    }
    else {
      iVar8 = 0;
      iVar7 = GA[local_28].corner_flag;
      *GA_Update_Signal = 1;
      for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
        local_38 = aCStack_78[local_18];
        if (aCStack_78[local_18] != 0) {
          piVar4 = (int *)*dst_ptr;
          if (piVar4 == (int *)0x0) {
            return 0;
          }
          lVar2 = (long)dst_ptr + local_30 * 4 + 0x10;
          piVar3 = (int *)(lVar2 + local_30 * 4);
          dst_ptr_00 = piVar3 + local_30 + 2;
          iVar9 = (int)lVar2;
          if (*piVar3 < 0xf4241) {
            ARMCI_PutS_flag((void *)dst_ptr[1],piVar4,dst_ptr_00,(int *)CONCAT44(iVar6,iVar5),ptr1,
                            in_stack_ffffffffffffff2c,(int *)CONCAT44(iVar8,iVar7),(int)piVar3,iVar9
                           );
          }
          else {
            ARMCI_PutS_flag((void *)dst_ptr[1],piVar4,dst_ptr_00,(int *)CONCAT44(iVar6,iVar5),ptr1,
                            in_stack_ffffffffffffff2c,(int *)CONCAT44(iVar8,iVar7),(int)piVar3,iVar9
                           );
          }
          iVar8 = iVar8 + 1;
          piVar4 = dst_ptr_00 + local_30 + 4 + local_30;
          local_a4 = (int)*(undefined8 *)(piVar4 + local_30);
          dst_ptr = (double *)(piVar4 + local_30 + 2);
          if (-1 < (long)ptr1) {
            local_a4 = PGRP_LIST[(long)ptr1].inv_map_proc_list[local_a4];
          }
          iVar9 = (int)(dst_ptr_00 + local_30 + 4);
          if (*piVar4 < 0xf4241) {
            in_stack_ffffffffffffff20 = *GA_Update_Signal;
            ARMCI_PutS_flag(*(void **)(dst_ptr_00 + 2),*(int **)dst_ptr_00,dst_ptr,
                            (int *)CONCAT44(iVar6,iVar5),ptr1,in_stack_ffffffffffffff2c,
                            (int *)CONCAT44(iVar8,iVar7),(int)piVar4,iVar9);
          }
          else {
            in_stack_ffffffffffffff20 = *GA_Update_Signal;
            ARMCI_PutS_flag(*(void **)(dst_ptr_00 + 2),*(int **)dst_ptr_00,dst_ptr,
                            (int *)CONCAT44(iVar6,iVar5),ptr1,in_stack_ffffffffffffff2c,
                            (int *)CONCAT44(iVar8,iVar7),(int)piVar4,iVar9);
          }
          iVar8 = iVar8 + 1;
          if (iVar7 != 0) {
            waitforflags(ptr1,(int *)CONCAT44(in_stack_ffffffffffffff2c,local_a4));
            GA_Update_Flags[GAme][iVar8 + -1] = 0;
            GA_Update_Flags[GAme][iVar8 + -2] = 0;
          }
        }
      }
      if (iVar7 == 0) {
        for (; iVar8 != 0; iVar8 = iVar8 + -2) {
          waitforflags(ptr1,(int *)CONCAT44(in_stack_ffffffffffffff2c,local_a4));
          GA_Update_Flags[GAme][iVar8 + -1] = 0;
          GA_Update_Flags[GAme][iVar8 + -2] = 0;
        }
      }
      if (iVar5 != 0) {
        pnga_pgroup_sync(CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_update5_ghosts(Integer g_a)
{
  Integer idx, i, handle=GA_OFFSET + g_a;
  Integer /*size,*/ ndim, nwidth;
  Integer width[MAXDIM];
  Integer* proc_rem_ptr;
  int *stride_loc, *stride_rem,*count;
  int msgcnt, corner_flag, proc_rem;
  /* int bytes; */
  char *ptr_loc, *ptr_rem,*cache;
  int local_sync_begin,local_sync_end;
  Integer p_handle;
#ifdef USE_MP_NORTHSOUTH
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr;
#endif
  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This operation is implemented using put calls to place the
   * appropriate data on remote processors. To signal the remote
   * processor that it has received the data, a second put call
   * consisting of a single integer is sent after the first put call and
   * used to update a signal buffer on the remote processor. Each
   * processor can determine how much data it has received by checking
   * its signal buffer. 
   */

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  p_handle = GA[handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(p_handle);

#ifdef USE_MP_NORTHSOUTH
  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");

  snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);
#endif
 
  cache = (char *)GA[handle].cache;
  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /*size = GA[handle].elemsize;*/
  ndim = GA[handle].ndim;
  for (i=0; i<ndim; i++) {
    width[i] = (Integer)GA[handle].width[i];
  }

  if (!gai_check_ghost_distr(g_a)) return FALSE;


  /* loop over dimensions for sequential update using shift algorithm */
  msgcnt = 0;
  corner_flag = GA[handle].corner_flag;
  (*GA_Update_Signal) = 1;
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      ptr_rem = *(char **)(cache);
      if(ptr_rem==NULL) return FALSE;
      ptr_loc = *(char **)(cache+sizeof(char *));
      stride_loc = (int *)(cache+2*sizeof(char *));
      stride_rem = (int *)(stride_loc+ndim);
      count = (int *)(stride_rem+ndim);
      proc_rem_ptr = (Integer *)(count+ndim);
      proc_rem = (int)(*proc_rem_ptr);
      cache = (char *)(proc_rem_ptr+1);
          
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      if(count[0]>1000000){
        /*tries to use armci direct put when possible */
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
      }
      else{
#ifndef USE_MP_NORTHSOUTH
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
#else
#endif
      }

      msgcnt++;

      /* Perform update in positive direction. */
      ptr_rem = *(char **)(cache);
      ptr_loc = *(char **)(cache+sizeof(char *));
      stride_loc = (int *)(cache+2*sizeof(char *));
      stride_rem = (int *)(stride_loc+ndim);
      count = (int *)(stride_rem+ndim);
      proc_rem_ptr = (Integer *)(count+ndim);
      proc_rem = (int)(*proc_rem_ptr);
      cache = (char *)(proc_rem_ptr+1);

      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      if(count[0]>1000000){
        /*tries to use armci direct put when possible */
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
      }
      else{
#ifndef USE_MP_NORTHSOUTH
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
#else
#endif

      }

      msgcnt++;

      if (corner_flag){
        /* check to make sure that last two messages have been recieved
           before starting update along a new dimension */
        waitforflags((GA_Update_Flags[GAme]+msgcnt-2),
          (GA_Update_Flags[GAme]+msgcnt-1));
        GA_Update_Flags[GAme][msgcnt-1]=0;
        GA_Update_Flags[GAme][msgcnt-2]=0;
      }
    }
  }
#if 1
  if (!corner_flag) {
    /* check to make sure that all messages have been recieved */
    while(msgcnt){
      waitforflags((GA_Update_Flags[GAme]+msgcnt-1),
          (GA_Update_Flags[GAme]+msgcnt-2));
      GA_Update_Flags[GAme][msgcnt-1]=0;
      GA_Update_Flags[GAme][msgcnt-2]=0;
      msgcnt-=2;
    }
  }
#endif 
  if(local_sync_end)pnga_pgroup_sync(p_handle);
  return TRUE;
}